

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_4_5_compatibility.cpp
# Opt level: O0

void __thiscall
QOpenGLFunctions_4_5_Compatibility::~QOpenGLFunctions_4_5_Compatibility
          (QOpenGLFunctions_4_5_Compatibility *this)

{
  undefined8 *in_RDI;
  QAbstractOpenGLFunctions *unaff_retaddr;
  
  *in_RDI = &PTR__QOpenGLFunctions_4_5_Compatibility_00214dd0;
  if (in_RDI[2] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c594e);
  }
  if (in_RDI[3] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c596c);
  }
  if (in_RDI[4] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c598a);
  }
  if (in_RDI[5] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c59a8);
  }
  if (in_RDI[6] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c59c6);
  }
  if (in_RDI[7] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c59e4);
  }
  if (in_RDI[8] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5a02);
  }
  if (in_RDI[9] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5a20);
  }
  if (in_RDI[10] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5a3e);
  }
  if (in_RDI[0xb] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5a5c);
  }
  if (in_RDI[0xc] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5a7a);
  }
  if (in_RDI[0xd] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5a98);
  }
  if (in_RDI[0xe] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5ab6);
  }
  if (in_RDI[0xf] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5ad4);
  }
  if (in_RDI[0x10] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5af8);
  }
  if (in_RDI[0x11] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5b1c);
  }
  if (in_RDI[0x12] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5b40);
  }
  if (in_RDI[0x13] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5b64);
  }
  if (in_RDI[0x14] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5b88);
  }
  if (in_RDI[0x15] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5bac);
  }
  if (in_RDI[0x16] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5bd0);
  }
  if (in_RDI[0x17] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5bf4);
  }
  if (in_RDI[0x18] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5c18);
  }
  if (in_RDI[0x19] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5c3c);
  }
  if (in_RDI[0x1a] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c5c60);
  }
  QAbstractOpenGLFunctions::~QAbstractOpenGLFunctions(unaff_retaddr);
  return;
}

Assistant:

QOpenGLFunctions_4_5_Compatibility::~QOpenGLFunctions_4_5_Compatibility()
{
    if (d_1_0_Core) {
        d_1_0_Core->refs.deref();
        Q_ASSERT(d_1_0_Core->refs.loadRelaxed());
    }
    if (d_1_1_Core) {
        d_1_1_Core->refs.deref();
        Q_ASSERT(d_1_1_Core->refs.loadRelaxed());
    }
    if (d_1_2_Core) {
        d_1_2_Core->refs.deref();
        Q_ASSERT(d_1_2_Core->refs.loadRelaxed());
    }
    if (d_1_3_Core) {
        d_1_3_Core->refs.deref();
        Q_ASSERT(d_1_3_Core->refs.loadRelaxed());
    }
    if (d_1_4_Core) {
        d_1_4_Core->refs.deref();
        Q_ASSERT(d_1_4_Core->refs.loadRelaxed());
    }
    if (d_1_5_Core) {
        d_1_5_Core->refs.deref();
        Q_ASSERT(d_1_5_Core->refs.loadRelaxed());
    }
    if (d_2_0_Core) {
        d_2_0_Core->refs.deref();
        Q_ASSERT(d_2_0_Core->refs.loadRelaxed());
    }
    if (d_2_1_Core) {
        d_2_1_Core->refs.deref();
        Q_ASSERT(d_2_1_Core->refs.loadRelaxed());
    }
    if (d_3_0_Core) {
        d_3_0_Core->refs.deref();
        Q_ASSERT(d_3_0_Core->refs.loadRelaxed());
    }
    if (d_3_1_Core) {
        d_3_1_Core->refs.deref();
        Q_ASSERT(d_3_1_Core->refs.loadRelaxed());
    }
    if (d_3_2_Core) {
        d_3_2_Core->refs.deref();
        Q_ASSERT(d_3_2_Core->refs.loadRelaxed());
    }
    if (d_3_3_Core) {
        d_3_3_Core->refs.deref();
        Q_ASSERT(d_3_3_Core->refs.loadRelaxed());
    }
    if (d_4_0_Core) {
        d_4_0_Core->refs.deref();
        Q_ASSERT(d_4_0_Core->refs.loadRelaxed());
    }
    if (d_4_1_Core) {
        d_4_1_Core->refs.deref();
        Q_ASSERT(d_4_1_Core->refs.loadRelaxed());
    }
    if (d_4_2_Core) {
        d_4_2_Core->refs.deref();
        Q_ASSERT(d_4_2_Core->refs.loadRelaxed());
    }
    if (d_4_3_Core) {
        d_4_3_Core->refs.deref();
        Q_ASSERT(d_4_3_Core->refs.loadRelaxed());
    }
    if (d_4_4_Core) {
        d_4_4_Core->refs.deref();
        Q_ASSERT(d_4_4_Core->refs.loadRelaxed());
    }
    if (d_4_5_Core) {
        d_4_5_Core->refs.deref();
        Q_ASSERT(d_4_5_Core->refs.loadRelaxed());
    }
    if (d_1_0_Deprecated) {
        d_1_0_Deprecated->refs.deref();
        Q_ASSERT(d_1_0_Deprecated->refs.loadRelaxed());
    }
    if (d_1_1_Deprecated) {
        d_1_1_Deprecated->refs.deref();
        Q_ASSERT(d_1_1_Deprecated->refs.loadRelaxed());
    }
    if (d_1_2_Deprecated) {
        d_1_2_Deprecated->refs.deref();
        Q_ASSERT(d_1_2_Deprecated->refs.loadRelaxed());
    }
    if (d_1_3_Deprecated) {
        d_1_3_Deprecated->refs.deref();
        Q_ASSERT(d_1_3_Deprecated->refs.loadRelaxed());
    }
    if (d_1_4_Deprecated) {
        d_1_4_Deprecated->refs.deref();
        Q_ASSERT(d_1_4_Deprecated->refs.loadRelaxed());
    }
    if (d_3_3_Deprecated) {
        d_3_3_Deprecated->refs.deref();
        Q_ASSERT(d_3_3_Deprecated->refs.loadRelaxed());
    }
    if (d_4_5_Deprecated) {
        d_4_5_Deprecated->refs.deref();
        Q_ASSERT(d_4_5_Deprecated->refs.loadRelaxed());
    }
}